

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

ON__LayerPerViewSettings * __thiscall
ON__LayerExtensions::ViewportSettings
          (ON__LayerExtensions *this,ON_Layer *layer,uchar *layer_m_extension_bits,
          ON_UUID viewport_id,bool bCreate)

{
  uint uVar1;
  ON__LayerPerViewSettings *pOVar2;
  ON_UUID *pOVar3;
  ON_UUID *pOVar4;
  ON_UUID *pOVar5;
  ON_UUID *pOVar6;
  ON_UUID *pOVar7;
  ON_UUID *pOVar8;
  ON_UUID *pOVar9;
  ON_UUID *pOVar10;
  ON_UUID *pOVar11;
  ON_UUID *pOVar12;
  ON_UUID *pOVar13;
  ON_UUID *pOVar14;
  ON_UUID *pOVar15;
  ON_UUID *pOVar16;
  ON_UUID *pOVar17;
  ON_UUID *pOVar18;
  bool bVar19;
  ON__LayerExtensions *pOVar20;
  ON__LayerPerViewSettings *pOVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ON_UUID viewport_id_local;
  
  viewport_id_local.Data4 = viewport_id._0_8_;
  viewport_id_local._0_8_ = layer_m_extension_bits;
  bVar19 = ON_UuidIsNil(&viewport_id_local);
  if (!bVar19) {
    pOVar20 = LayerExtensions((ON_Layer *)this,(uchar *)layer,viewport_id.Data4[0]);
    lVar22 = 0;
    if (pOVar20 == (ON__LayerExtensions *)0x0) {
      return (ON__LayerPerViewSettings *)0x0;
    }
    uVar1 = (pOVar20->m_vp_settings).m_count;
    uVar23 = 0;
    if (0 < (int)uVar1) {
      uVar23 = (ulong)uVar1;
    }
    pOVar2 = (pOVar20->m_vp_settings).m_a;
    pOVar21 = pOVar2;
    while (lVar22 = lVar22 + -0x28, lVar22 + (uVar23 + 1) * 0x28 != 0) {
      pOVar3 = &pOVar21->m_viewport_id;
      pOVar4 = &pOVar21->m_viewport_id;
      pOVar5 = &pOVar21->m_viewport_id;
      pOVar6 = &pOVar21->m_viewport_id;
      pOVar7 = &pOVar21->m_viewport_id;
      pOVar8 = &pOVar21->m_viewport_id;
      pOVar9 = &pOVar21->m_viewport_id;
      pOVar10 = &pOVar21->m_viewport_id;
      pOVar11 = &pOVar21->m_viewport_id;
      pOVar12 = &pOVar21->m_viewport_id;
      pOVar13 = &pOVar21->m_viewport_id;
      pOVar14 = &pOVar21->m_viewport_id;
      pOVar15 = &pOVar21->m_viewport_id;
      pOVar16 = &pOVar21->m_viewport_id;
      pOVar17 = &pOVar21->m_viewport_id;
      pOVar18 = &pOVar21->m_viewport_id;
      pOVar21 = pOVar21 + 1;
      auVar24[0] = -((char)viewport_id_local.Data1 == (char)pOVar3->Data1);
      auVar24[1] = -(viewport_id_local.Data1._1_1_ == *(char *)((long)&pOVar4->Data1 + 1));
      auVar24[2] = -(viewport_id_local.Data1._2_1_ == *(char *)((long)&pOVar5->Data1 + 2));
      auVar24[3] = -(viewport_id_local.Data1._3_1_ == *(char *)((long)&pOVar6->Data1 + 3));
      auVar24[4] = -((char)viewport_id_local.Data2 == (char)pOVar7->Data2);
      auVar24[5] = -(viewport_id_local.Data2._1_1_ == *(char *)((long)&pOVar8->Data2 + 1));
      auVar24[6] = -((char)viewport_id_local.Data3 == (char)pOVar9->Data3);
      auVar24[7] = -(viewport_id_local.Data3._1_1_ == *(char *)((long)&pOVar10->Data3 + 1));
      auVar24[8] = -(viewport_id_local.Data4[0] == pOVar11->Data4[0]);
      auVar24[9] = -(viewport_id_local.Data4[1] == pOVar12->Data4[1]);
      auVar24[10] = -(viewport_id_local.Data4[2] == pOVar13->Data4[2]);
      auVar24[0xb] = -(viewport_id_local.Data4[3] == pOVar14->Data4[3]);
      auVar24[0xc] = -(viewport_id_local.Data4[4] == pOVar15->Data4[4]);
      auVar24[0xd] = -(viewport_id_local.Data4[5] == pOVar16->Data4[5]);
      auVar24[0xe] = -(viewport_id_local.Data4[6] == pOVar17->Data4[6]);
      auVar24[0xf] = -(viewport_id_local.Data4[7] == pOVar18->Data4[7]);
      if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
        return (ON__LayerPerViewSettings *)((long)pOVar2 + (-0x28 - lVar22));
      }
    }
    if (viewport_id.Data4[0] != false) {
      pOVar21 = ON_SimpleArray<ON__LayerPerViewSettings>::AppendNew(&pOVar20->m_vp_settings);
      pOVar2 = (pOVar20->m_vp_settings).m_a;
      ON__LayerPerViewSettings::SetDefaultValues(pOVar21);
      (pOVar21->m_viewport_id).Data1 = viewport_id_local.Data1;
      (pOVar21->m_viewport_id).Data2 = viewport_id_local.Data2;
      (pOVar21->m_viewport_id).Data3 = viewport_id_local.Data3;
      *&(pOVar21->m_viewport_id).Data4 = viewport_id_local.Data4;
      ON_SimpleArray<ON__LayerPerViewSettings>::QuickSort
                (&pOVar20->m_vp_settings,ON__LayerPerViewSettings::Compare);
      lVar22 = -1;
      do {
        pOVar21 = pOVar2;
        lVar22 = lVar22 + 1;
        if ((int)uVar1 < lVar22) {
          return (ON__LayerPerViewSettings *)0x0;
        }
        auVar25[0] = -((char)viewport_id_local.Data1 == (char)(pOVar21->m_viewport_id).Data1);
        auVar25[1] = -(viewport_id_local.Data1._1_1_ ==
                      *(char *)((long)&(pOVar21->m_viewport_id).Data1 + 1));
        auVar25[2] = -(viewport_id_local.Data1._2_1_ ==
                      *(char *)((long)&(pOVar21->m_viewport_id).Data1 + 2));
        auVar25[3] = -(viewport_id_local.Data1._3_1_ ==
                      *(char *)((long)&(pOVar21->m_viewport_id).Data1 + 3));
        auVar25[4] = -((char)viewport_id_local.Data2 == (char)(pOVar21->m_viewport_id).Data2);
        auVar25[5] = -(viewport_id_local.Data2._1_1_ ==
                      *(char *)((long)&(pOVar21->m_viewport_id).Data2 + 1));
        auVar25[6] = -((char)viewport_id_local.Data3 == (char)(pOVar21->m_viewport_id).Data3);
        auVar25[7] = -(viewport_id_local.Data3._1_1_ ==
                      *(char *)((long)&(pOVar21->m_viewport_id).Data3 + 1));
        auVar25[8] = -(viewport_id_local.Data4[0] == (pOVar21->m_viewport_id).Data4[0]);
        auVar25[9] = -(viewport_id_local.Data4[1] == (pOVar21->m_viewport_id).Data4[1]);
        auVar25[10] = -(viewport_id_local.Data4[2] == (pOVar21->m_viewport_id).Data4[2]);
        auVar25[0xb] = -(viewport_id_local.Data4[3] == (pOVar21->m_viewport_id).Data4[3]);
        auVar25[0xc] = -(viewport_id_local.Data4[4] == (pOVar21->m_viewport_id).Data4[4]);
        auVar25[0xd] = -(viewport_id_local.Data4[5] == (pOVar21->m_viewport_id).Data4[5]);
        auVar25[0xe] = -(viewport_id_local.Data4[6] == (pOVar21->m_viewport_id).Data4[6]);
        auVar25[0xf] = -(viewport_id_local.Data4[7] == (pOVar21->m_viewport_id).Data4[7]);
        pOVar2 = pOVar21 + 1;
      } while ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff);
      return pOVar21;
    }
  }
  return (ON__LayerPerViewSettings *)0x0;
}

Assistant:

ON__LayerPerViewSettings* ON__LayerExtensions::ViewportSettings( 
  const ON_Layer& layer,
  const unsigned char* layer_m_extension_bits,
  ON_UUID viewport_id,
  bool bCreate
  )
{
  if ( !ON_UuidIsNil(viewport_id) )
  {
    ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(layer,layer_m_extension_bits,bCreate);
    if ( ud )
    {
      int i;
      const int vp_settings_count = ud->m_vp_settings.Count();
      ON__LayerPerViewSettings* vp_settings = ud->m_vp_settings.Array();
      for ( i = 0; i < vp_settings_count; i++ )
      {
        if ( 0 == memcmp(&viewport_id,&vp_settings[i].m_viewport_id,sizeof(ON_UUID)) )
          return (vp_settings+i);
      }
      if ( bCreate )
      {
        ON__LayerPerViewSettings& new_vp_settings = ud->m_vp_settings.AppendNew();
        vp_settings = ud->m_vp_settings.Array(); // appending can grow the array
        new_vp_settings.SetDefaultValues();
        new_vp_settings.m_viewport_id = viewport_id;

        // to make ON_Layer::PerViewportSettingsCRC() return
        // equal values for equal settings, it is critical
        // that m_vp_settings[] be sorted.
        ud->m_vp_settings.QuickSort(ON__LayerPerViewSettings::Compare);

        for ( i = 0; i <= vp_settings_count; i++ ) // "i <= ..." is correct because of the .AppendNew()
        {
          if ( 0 == memcmp(&viewport_id,&vp_settings[i].m_viewport_id,sizeof(ON_UUID)) )
            return (vp_settings+i);
        }
      }
    }
  }
  return 0;
}